

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

void buf_add_log(MppBufferImpl *buffer,MppBufOps ops,char *caller)

{
  if (buffer->log_runtime_en != 0) {
    _mpp_log_l(4,"mpp_buffer","group %3d buffer %4d fd %3d ops %s ref_count %d caller %s\n",
               (char *)0x0,(ulong)buffer->group_id,(ulong)(uint)buffer->buffer_id,
               (ulong)(uint)(buffer->info).fd,ops2str[ops],(ulong)(uint)buffer->ref_count,caller);
  }
  if (buffer->logs != (MppBufLogs *)0x0) {
    buf_logs_write(buffer->logs,buffer->group_id,buffer->buffer_id,ops,buffer->ref_count,caller);
    return;
  }
  return;
}

Assistant:

static void buf_add_log(MppBufferImpl *buffer, MppBufOps ops, const char* caller)
{
    if (buffer->log_runtime_en) {
        mpp_log("group %3d buffer %4d fd %3d ops %s ref_count %d caller %s\n",
                buffer->group_id, buffer->buffer_id, buffer->info.fd,
                ops2str[ops], buffer->ref_count, caller);
    }
    if (buffer->logs)
        buf_logs_write(buffer->logs, buffer->group_id, buffer->buffer_id,
                       ops, buffer->ref_count, caller);
}